

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Record_Query_R_PDU::SetRecordIDs
          (Record_Query_R_PDU *this,vector<unsigned_int,_std::allocator<unsigned_int>_> *ID)

{
  size_type sVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *ID_local;
  Record_Query_R_PDU *this_local;
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear(&this->m_vui32RecID);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->m_vui32RecID,ID);
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_vui32RecID);
  this->m_ui32NumRecs = (KUINT32)sVar1;
  (this->super_Simulation_Management_Header).super_Header.super_Header6.m_ui16PDULength =
       (short)(this->m_ui32NumRecs << 2) + 0x28;
  return;
}

Assistant:

void Record_Query_R_PDU::SetRecordIDs( const vector<KUINT32> & ID )
{
    m_vui32RecID.clear();
    m_vui32RecID = ID;
    m_ui32NumRecs = m_vui32RecID.size();
    m_ui16PDULength = RECORD_QUERY_R_PDU_SIZE + ( m_ui32NumRecs * 4 );
}